

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,double,duckdb::QuantileIndirect<duckdb::hugeint_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::hugeint_t> *accessor)

{
  CURSOR *pCVar1;
  duckdb *pdVar2;
  uint64_t uVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  InvalidInputException *pIVar7;
  int64_t iVar8;
  uint uVar9;
  double dVar10;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t hVar11;
  hugeint_t hVar12;
  hugeint_t hVar13;
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  pCVar1 = accessor->data;
  uVar6 = (pCVar1->scan).current_row_index;
  bVar4 = (pCVar1->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar6 || bVar4) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar1->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar1->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      pCVar1->data = *(hugeint_t **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar1->validity = (ValidityMask *)(pvVar5 + 0x28);
      uVar6 = (pCVar1->scan).current_row_index;
    }
    uVar9 = (int)lidx - (int)uVar6;
    pdVar2 = (duckdb *)pCVar1->data[uVar9].lower;
    uVar3 = pCVar1->data[uVar9].upper;
    iVar8 = 0;
    hVar11.upper = uVar3;
    hVar11.lower = (uint64_t)pdVar2;
    bVar4 = duckdb::TryCast::Operation<duckdb::hugeint_t,double>(hVar11,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.upper = iVar8;
      input.lower = uVar3;
      CastExceptionText<duckdb::hugeint_t,double>(&local_58,pdVar2,input);
      duckdb::InvalidInputException::InvalidInputException(pIVar7,(string *)&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (lidx < uVar6 || bVar4) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar1->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar1->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      pCVar1->data = *(hugeint_t **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar1->validity = (ValidityMask *)(pvVar5 + 0x28);
      uVar6 = (pCVar1->scan).current_row_index;
    }
    uVar9 = (int)lidx - (int)uVar6;
    pdVar2 = (duckdb *)pCVar1->data[uVar9].lower;
    uVar3 = pCVar1->data[uVar9].upper;
    iVar8 = 0;
    hVar12.upper = uVar3;
    hVar12.lower = (uint64_t)pdVar2;
    bVar4 = duckdb::TryCast::Operation<duckdb::hugeint_t,double>(hVar12,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.upper = iVar8;
      input_00.lower = uVar3;
      CastExceptionText<duckdb::hugeint_t,double>(&local_58,pdVar2,input_00);
      duckdb::InvalidInputException::InvalidInputException(pIVar7,(string *)&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_38 = local_60;
    pCVar1 = accessor->data;
    uVar6 = (pCVar1->scan).current_row_index;
    if ((pCVar1->scan).next_row_index <= hidx || hidx < uVar6) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar1->inputs,(ColumnDataScanState *)hidx,(DataChunk *)&pCVar1->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      pCVar1->data = *(hugeint_t **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar1->validity = (ValidityMask *)(pvVar5 + 0x28);
      uVar6 = (pCVar1->scan).current_row_index;
    }
    uVar9 = (int)hidx - (int)uVar6;
    pdVar2 = (duckdb *)pCVar1->data[uVar9].lower;
    uVar3 = pCVar1->data[uVar9].upper;
    iVar8 = 0;
    hVar13.upper = uVar3;
    hVar13.lower = (uint64_t)pdVar2;
    bVar4 = duckdb::TryCast::Operation<duckdb::hugeint_t,double>(hVar13,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.upper = iVar8;
      input_01.lower = uVar3;
      CastExceptionText<duckdb::hugeint_t,double>(&local_58,pdVar2,input_01);
      duckdb::InvalidInputException::InvalidInputException(pIVar7,(string *)&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar10 = this->RN -
             (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar10 * local_60 + local_38 * (1.0 - dVar10);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}